

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSAPublicKey.cpp
# Opt level: O2

void __thiscall OSSLRSAPublicKey::setFromOSSL(OSSLRSAPublicKey *this,RSA *inRSA)

{
  BIGNUM *bn_e;
  ByteString inN;
  BIGNUM *bn_n;
  BIGNUM *local_48;
  ByteString local_40;
  BIGNUM *local_18;
  
  local_18 = (BIGNUM *)0x0;
  local_48 = (BIGNUM *)0x0;
  RSA_get0_key(inRSA,&local_18,&local_48,0);
  if (local_18 != (BIGNUM *)0x0) {
    OSSL::bn2ByteString(&local_40,local_18);
    (**(code **)(*(long *)&this->super_RSAPublicKey + 0x30))(this,&local_40);
    ByteString::~ByteString(&local_40);
  }
  if (local_48 != (BIGNUM *)0x0) {
    OSSL::bn2ByteString(&local_40,local_48);
    (**(code **)(*(long *)&this->super_RSAPublicKey + 0x38))(this,&local_40);
    ByteString::~ByteString(&local_40);
  }
  return;
}

Assistant:

void OSSLRSAPublicKey::setFromOSSL(const RSA* inRSA)
{
	const BIGNUM* bn_n = NULL;
	const BIGNUM* bn_e = NULL;

	RSA_get0_key(inRSA, &bn_n, &bn_e, NULL);

	if (bn_n)
	{
		ByteString inN = OSSL::bn2ByteString(bn_n);
		setN(inN);
	}
	if (bn_e)
	{
		ByteString inE = OSSL::bn2ByteString(bn_e);
		setE(inE);
	}
}